

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  undefined4 uVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  MessageLite *pMVar5;
  slot_type *psVar6;
  slot_type *psVar7;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar8;
  void *p;
  bool bVar9;
  slot_type *psVar10;
  RawHashSetLayout RStack_40;
  
  psVar2 = (slot_type *)(a->inner_).ctrl_;
  if ((psVar2 == (slot_type *)
                 absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)&psVar2->message)) {
    psVar3 = (slot_type *)(b->inner_).ctrl_;
    if ((psVar3 != (slot_type *)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)&psVar3->message < '\0')) goto LAB_00140336;
    if (psVar2 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double> &&
        psVar3 == (slot_type *)
                  absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
LAB_00140329:
      return psVar2 == psVar3;
    }
    if ((psVar2 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) !=
        (psVar3 ==
        (slot_type *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>))
    goto LAB_0014033b;
    if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_00140329;
    if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
      a = (const_iterator *)(a->inner_).field_1.slot_;
      psVar4 = (b->inner_).field_1.slot_;
      if (psVar2 == (slot_type *)&kSooControl) {
        bVar9 = (slot_type *)a == psVar4;
      }
      else {
        psVar10 = psVar4;
        psVar6 = psVar3;
        psVar7 = (slot_type *)a;
        if (psVar3 < psVar2) {
          psVar10 = (slot_type *)a;
          psVar6 = psVar2;
          psVar7 = psVar4;
        }
        bVar9 = psVar7 <= psVar10 && psVar6 < psVar7;
      }
      if (bVar9) goto LAB_00140329;
    }
  }
  else {
    operator==();
LAB_00140336:
    operator==();
LAB_0014033b:
    operator==();
  }
  operator==();
  pMVar5 = ((slot_type *)a)->message;
  if (pMVar5 == (MessageLite *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pMVar5 != (MessageLite *)
                     absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>) {
    if (-1 < (char)*(code *)&pMVar5->_vptr_MessageLite) {
      uVar1 = ((slot_type *)a)->number;
      return SUB41(uVar1,0);
    }
    goto LAB_00140374;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
  ::iterator::operator*((iterator *)a);
LAB_00140374:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
  ::iterator::operator*((iterator *)a);
  uVar8 = extraout_AL;
  if ((slot_type *)a != (slot_type *)0x0) {
    if (((slot_type *)a)->message != (MessageLite *)0x0) {
      if ((((slot_type *)a)->number & 1) != 0) {
        CommonFields::backing_array_start((CommonFields *)a);
      }
      p = CommonFields::backing_array_start((CommonFields *)a);
      RawHashSetLayout::RawHashSetLayout
                (&RStack_40,(size_t)((slot_type *)a)->message,8,
                 (bool)((byte)((slot_type *)a)->number & 1));
      Deallocate<8ul,std::allocator<google::protobuf::internal::ExtensionInfo>>
                ((allocator<google::protobuf::internal::ExtensionInfo> *)a,p,
                 RStack_40.capacity_ * 0x30 + RStack_40.slot_offset_);
    }
    operator_delete(a,0x20);
    uVar8 = extraout_AL_00;
  }
  return (bool)uVar8;
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }